

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

Node * __thiscall
TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit>::GetNode
          (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this,FModelVertex key)

{
  FModelVertex key_00;
  FIndexInit local_51;
  undefined1 auStack_50 [7];
  FIndexInit traits;
  Node *n;
  TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *this_local;
  
  key_00 = key;
  this_local = (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *)FindKey(this,key);
  if ((Node *)this_local == (Node *)0x0) {
    auStack_50._0_4_ = key.x;
    unique0x00012004 = key.y;
    this_local = (TMap<FModelVertex,_unsigned_int,_FVoxelVertexHash,_FIndexInit> *)
                 NewKey(this,key_00);
    FIndexInit::Init(&local_51,&(((Node *)this_local)->Pair).Value);
  }
  return (Node *)this_local;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}